

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O2

size_t __thiscall tf::Node::num_strong_dependencies(Node *this)

{
  void *pvVar1;
  size_t sVar2;
  ulong uVar3;
  
  pvVar1 = (this->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
  sVar2 = 0;
  for (uVar3 = this->_num_successors;
      uVar3 < (ulong)((long)(this->_edges).super_SmallVectorImpl<tf::Node_*>.
                            super_SmallVectorTemplateBase<tf::Node_*,_true>.
                            super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.
                            EndX - (long)pvVar1 >> 3); uVar3 = uVar3 + 1) {
    sVar2 = sVar2 + ((*(byte *)(*(long *)((long)pvVar1 + uVar3 * 8) + 0xc0) & 0xfe) != 4);
  }
  return sVar2;
}

Assistant:

inline size_t Node::num_strong_dependencies() const {
  size_t n = 0;
  for(size_t i=_num_successors; i<_edges.size(); i++) {
    n += !_edges[i]->_is_conditioner();
  }
  return n;
}